

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-record.c
# Opt level: O0

void big_record_type_clear(BigRecordType *rtype)

{
  int local_14;
  int i;
  BigRecordType *rtype_local;
  
  for (local_14 = 0; (ulong)(long)local_14 < rtype->nfield; local_14 = local_14 + 1) {
    free(rtype->fields[local_14].name);
  }
  free(rtype->fields);
  rtype->nfield = 0;
  rtype->fields = (BigRecordField *)0x0;
  return;
}

Assistant:

void
big_record_type_clear(BigRecordType * rtype)
{
    int i;
    for(i = 0; i < rtype->nfield; i ++) {
        free(rtype->fields[i].name);
    }
    free(rtype->fields);
    rtype->nfield = 0;
    rtype->fields = NULL;
}